

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O2

void ITransform_SSE2(uint8_t *ref,int16_t *in,uint8_t *dst,int do_two)

{
  ulong uVar1;
  ulong uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [15];
  unkuint9 Var50;
  undefined1 auVar51 [11];
  undefined1 auVar52 [13];
  undefined1 auVar53 [15];
  undefined1 auVar54 [11];
  undefined1 auVar55 [15];
  undefined1 auVar56 [11];
  undefined1 auVar57 [13];
  undefined1 auVar58 [15];
  undefined1 auVar59 [11];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined6 uVar72;
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [12];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  short sVar78;
  short sVar81;
  short sVar82;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  short sVar87;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  short sVar88;
  ulong uVar89;
  short sVar93;
  short sVar94;
  short sVar96;
  undefined4 uVar97;
  short sVar99;
  undefined1 auVar90 [16];
  short sVar95;
  short sVar98;
  short sVar101;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined4 uVar100;
  short sVar102;
  ulong uVar103;
  short sVar107;
  short sVar108;
  short sVar109;
  short sVar110;
  short sVar111;
  short sVar112;
  short sVar113;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  short sVar120;
  short sVar121;
  short sVar122;
  short sVar123;
  short sVar124;
  undefined1 auVar114 [16];
  short sVar125;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  short sVar128;
  short sVar129;
  short sVar130;
  short sVar131;
  short sVar132;
  undefined1 auVar126 [16];
  short sVar133;
  undefined1 auVar127 [16];
  short sVar134;
  short sVar137;
  short sVar138;
  short sVar139;
  short sVar140;
  short sVar141;
  short sVar142;
  undefined1 auVar135 [16];
  short sVar143;
  undefined1 auVar136 [16];
  
  if (do_two != 0) {
    auVar127 = *(undefined1 (*) [16])in;
    auVar136 = *(undefined1 (*) [16])(in + 8);
    auVar105 = *(undefined1 (*) [16])(in + 0x10);
    auVar118 = *(undefined1 (*) [16])(in + 0x18);
    auVar90._8_8_ = auVar105._8_8_;
    auVar90._0_8_ = auVar127._8_8_;
    auVar114._8_8_ = auVar118._8_8_;
    auVar114._0_8_ = auVar136._8_8_;
    sVar102 = auVar136._0_2_ + auVar127._0_2_;
    sVar107 = auVar136._2_2_ + auVar127._2_2_;
    sVar108 = auVar136._4_2_ + auVar127._4_2_;
    sVar109 = auVar136._6_2_ + auVar127._6_2_;
    sVar110 = auVar118._0_2_ + auVar105._0_2_;
    sVar111 = auVar118._2_2_ + auVar105._2_2_;
    sVar112 = auVar118._4_2_ + auVar105._4_2_;
    sVar113 = auVar118._6_2_ + auVar105._6_2_;
    sVar78 = auVar127._0_2_ - auVar136._0_2_;
    sVar81 = auVar127._2_2_ - auVar136._2_2_;
    sVar82 = auVar127._4_2_ - auVar136._4_2_;
    sVar83 = auVar127._6_2_ - auVar136._6_2_;
    sVar84 = auVar105._0_2_ - auVar118._0_2_;
    sVar85 = auVar105._2_2_ - auVar118._2_2_;
    sVar86 = auVar105._4_2_ - auVar118._4_2_;
    sVar87 = auVar105._6_2_ - auVar118._6_2_;
    auVar126 = pmulhw(auVar90,_DAT_0017cbf0);
    auVar135 = pmulhw(auVar114,_DAT_0017cc00);
    sVar134 = (auVar127._8_2_ - auVar136._8_2_) + (auVar126._0_2_ - auVar135._0_2_);
    sVar137 = (auVar127._10_2_ - auVar136._10_2_) + (auVar126._2_2_ - auVar135._2_2_);
    sVar138 = (auVar127._12_2_ - auVar136._12_2_) + (auVar126._4_2_ - auVar135._4_2_);
    sVar139 = (auVar127._14_2_ - auVar136._14_2_) + (auVar126._6_2_ - auVar135._6_2_);
    sVar140 = (auVar105._8_2_ - auVar118._8_2_) + (auVar126._8_2_ - auVar135._8_2_);
    sVar141 = (auVar105._10_2_ - auVar118._10_2_) + (auVar126._10_2_ - auVar135._10_2_);
    sVar142 = (auVar105._12_2_ - auVar118._12_2_) + (auVar126._12_2_ - auVar135._12_2_);
    sVar143 = (auVar105._14_2_ - auVar118._14_2_) + (auVar126._14_2_ - auVar135._14_2_);
    auVar135 = pmulhw(auVar114,_DAT_0017cbf0);
    auVar126 = pmulhw(auVar90,_DAT_0017cc00);
    sVar88 = auVar126._0_2_ + auVar136._8_2_ + auVar127._8_2_ + auVar135._0_2_;
    sVar93 = auVar126._2_2_ + auVar136._10_2_ + auVar127._10_2_ + auVar135._2_2_;
    sVar94 = auVar126._4_2_ + auVar136._12_2_ + auVar127._12_2_ + auVar135._4_2_;
    sVar95 = auVar126._6_2_ + auVar136._14_2_ + auVar127._14_2_ + auVar135._6_2_;
    sVar96 = auVar126._8_2_ + auVar118._8_2_ + auVar105._8_2_ + auVar135._8_2_;
    sVar98 = auVar126._10_2_ + auVar118._10_2_ + auVar105._10_2_ + auVar135._10_2_;
    sVar99 = auVar126._12_2_ + auVar118._12_2_ + auVar105._12_2_ + auVar135._12_2_;
    sVar101 = auVar126._14_2_ + auVar118._14_2_ + auVar105._14_2_ + auVar135._14_2_;
    sVar128 = sVar93 + sVar107;
    sVar129 = sVar94 + sVar108;
    sVar130 = sVar95 + sVar109;
    sVar131 = sVar98 + sVar111;
    sVar132 = sVar99 + sVar112;
    sVar133 = sVar101 + sVar113;
    sVar120 = sVar137 + sVar81;
    sVar121 = sVar138 + sVar82;
    sVar122 = sVar139 + sVar83;
    sVar123 = sVar141 + sVar85;
    sVar124 = sVar142 + sVar86;
    sVar125 = sVar143 + sVar87;
    sVar81 = sVar81 - sVar137;
    sVar82 = sVar82 - sVar138;
    sVar83 = sVar83 - sVar139;
    sVar85 = sVar85 - sVar141;
    sVar86 = sVar86 - sVar142;
    sVar87 = sVar87 - sVar143;
    sVar107 = sVar107 - sVar93;
    sVar108 = sVar108 - sVar94;
    sVar109 = sVar109 - sVar95;
    sVar111 = sVar111 - sVar98;
    sVar112 = sVar112 - sVar99;
    sVar113 = sVar113 - sVar101;
    auVar47._4_8_ =
         (long)(((unkuint10)(uint6)(((unkuint10)CONCAT22(sVar122,sVar130) << 0x30) >> 0x20) << 0x20)
               >> 0x10);
    auVar47._2_2_ = sVar120;
    auVar47._0_2_ = sVar128;
    auVar115._0_8_ = auVar47._0_8_ << 0x20;
    auVar48._4_8_ =
         (long)(((unkuint10)(uint6)(((unkuint10)CONCAT22(sVar109,sVar83) << 0x30) >> 0x20) << 0x20)
               >> 0x10);
    auVar48._2_2_ = sVar107;
    auVar48._0_2_ = sVar81;
    auVar75._10_2_ = sVar111;
    auVar75._8_2_ = sVar85;
    auVar115._8_4_ = auVar47._0_4_;
    auVar115._12_4_ = auVar48._0_4_;
    auVar75._4_4_ = CONCAT22(sVar123,sVar131);
    auVar75._0_4_ = CONCAT22(sVar123,sVar131);
    auVar91._4_4_ = CONCAT22(sVar109,sVar83);
    auVar91._0_4_ = CONCAT22(sVar122,sVar130);
    auVar91._12_4_ = (int)(CONCAT24(sVar113,CONCAT22(sVar87,sVar112)) >> 0x10);
    auVar91._8_4_ = (int)(CONCAT24(sVar125,CONCAT22(sVar133,sVar124)) >> 0x10);
    auVar116._8_8_ = auVar75._4_8_;
    auVar116._0_8_ = auVar115._8_8_;
    sVar93 = sVar88 + sVar102 + 4;
    sVar94 = sVar134 + sVar78 + 4;
    sVar78 = (sVar78 - sVar134) + 4;
    sVar88 = (sVar102 - sVar88) + 4;
    sVar95 = sVar96 + sVar110 + 4;
    sVar98 = sVar140 + sVar84 + 4;
    sVar84 = (sVar84 - sVar140) + 4;
    sVar96 = (sVar110 - sVar96) + 4;
    sVar102 = sVar93 + sVar129;
    sVar110 = sVar94 + sVar121;
    sVar134 = sVar78 + sVar82;
    sVar137 = sVar88 + sVar108;
    sVar138 = sVar95 + sVar132;
    sVar139 = sVar98 + sVar124;
    sVar140 = sVar84 + sVar86;
    sVar141 = sVar96 + sVar112;
    sVar93 = sVar93 - sVar129;
    sVar94 = sVar94 - sVar121;
    sVar78 = sVar78 - sVar82;
    sVar88 = sVar88 - sVar108;
    sVar95 = sVar95 - sVar132;
    sVar98 = sVar98 - sVar124;
    sVar84 = sVar84 - sVar86;
    sVar96 = sVar96 - sVar112;
    auVar127 = pmulhw(auVar116,_DAT_0017cbf0);
    auVar136 = pmulhw(auVar91,_DAT_0017cc00);
    sVar108 = (sVar128 - sVar130) + (auVar127._0_2_ - auVar136._0_2_);
    sVar112 = (sVar120 - sVar122) + (auVar127._2_2_ - auVar136._2_2_);
    sVar121 = (sVar81 - sVar83) + (auVar127._4_2_ - auVar136._4_2_);
    sVar124 = (sVar107 - sVar109) + (auVar127._6_2_ - auVar136._6_2_);
    sVar129 = (sVar131 - sVar133) + (auVar127._8_2_ - auVar136._8_2_);
    sVar132 = (sVar123 - sVar125) + (auVar127._10_2_ - auVar136._10_2_);
    sVar142 = (sVar85 - sVar87) + (auVar127._12_2_ - auVar136._12_2_);
    sVar143 = (sVar111 - sVar113) + (auVar127._14_2_ - auVar136._14_2_);
    auVar136 = pmulhw(_DAT_0017cc00,auVar116);
    auVar127 = pmulhw(_DAT_0017cbf0,auVar91);
    sVar82 = sVar130 + sVar128 + auVar127._0_2_ + auVar136._0_2_;
    sVar86 = sVar122 + sVar120 + auVar127._2_2_ + auVar136._2_2_;
    sVar81 = sVar83 + sVar81 + auVar127._4_2_ + auVar136._4_2_;
    sVar83 = sVar109 + sVar107 + auVar127._6_2_ + auVar136._6_2_;
    sVar99 = sVar133 + sVar131 + auVar127._8_2_ + auVar136._8_2_;
    sVar101 = sVar125 + sVar123 + auVar127._10_2_ + auVar136._10_2_;
    sVar85 = sVar87 + sVar85 + auVar127._12_2_ + auVar136._12_2_;
    sVar87 = sVar113 + sVar111 + auVar127._14_2_ + auVar136._14_2_;
    auVar76._0_2_ = sVar102 + sVar82;
    auVar76._2_2_ = sVar110 + sVar86;
    auVar76._4_2_ = sVar134 + sVar81;
    auVar76._6_2_ = sVar137 + sVar83;
    auVar76._8_2_ = sVar138 + sVar99;
    auVar76._10_2_ = sVar139 + sVar101;
    auVar76._12_2_ = sVar140 + sVar85;
    auVar76._14_2_ = sVar141 + sVar87;
    auVar117._0_2_ = sVar93 + sVar108;
    auVar117._2_2_ = sVar94 + sVar112;
    auVar117._4_2_ = sVar78 + sVar121;
    auVar117._6_2_ = sVar88 + sVar124;
    auVar117._8_2_ = sVar95 + sVar129;
    auVar117._10_2_ = sVar98 + sVar132;
    auVar117._12_2_ = sVar84 + sVar142;
    auVar117._14_2_ = sVar96 + sVar143;
    auVar79._0_2_ = sVar93 - sVar108;
    auVar79._2_2_ = sVar94 - sVar112;
    auVar79._4_2_ = sVar78 - sVar121;
    auVar79._6_2_ = sVar88 - sVar124;
    auVar79._8_2_ = sVar95 - sVar129;
    auVar79._10_2_ = sVar98 - sVar132;
    auVar79._12_2_ = sVar84 - sVar142;
    auVar79._14_2_ = sVar96 - sVar143;
    auVar104._0_2_ = sVar102 - sVar82;
    auVar104._2_2_ = sVar110 - sVar86;
    auVar104._4_2_ = sVar134 - sVar81;
    auVar104._6_2_ = sVar137 - sVar83;
    auVar104._8_2_ = sVar138 - sVar99;
    auVar104._10_2_ = sVar139 - sVar101;
    auVar104._12_2_ = sVar140 - sVar85;
    auVar104._14_2_ = sVar141 - sVar87;
    auVar127 = psraw(auVar76,3);
    auVar118 = psraw(auVar117,3);
    auVar136 = psraw(auVar79,3);
    auVar105 = psraw(auVar104,3);
    uVar89 = *(ulong *)ref;
    uVar103 = *(ulong *)(ref + 0x20);
    uVar1 = *(ulong *)(ref + 0x40);
    uVar2 = *(ulong *)(ref + 0x60);
    auVar10._8_6_ = 0;
    auVar10._0_8_ = uVar89;
    auVar10[0xe] = (char)(uVar89 >> 0x38);
    auVar16._8_4_ = 0;
    auVar16._0_8_ = uVar89;
    auVar16[0xc] = (char)(uVar89 >> 0x30);
    auVar16._13_2_ = auVar10._13_2_;
    auVar22._8_4_ = 0;
    auVar22._0_8_ = uVar89;
    auVar22._12_3_ = auVar16._12_3_;
    auVar28._8_2_ = 0;
    auVar28._0_8_ = uVar89;
    auVar28[10] = (char)(uVar89 >> 0x28);
    auVar28._11_4_ = auVar22._11_4_;
    auVar34._8_2_ = 0;
    auVar34._0_8_ = uVar89;
    auVar34._10_5_ = auVar28._10_5_;
    auVar40[8] = (char)(uVar89 >> 0x20);
    auVar40._0_8_ = uVar89;
    auVar40._9_6_ = auVar34._9_6_;
    auVar49._7_8_ = 0;
    auVar49._0_7_ = auVar40._8_7_;
    Var50 = CONCAT81(SUB158(auVar49 << 0x40,7),(char)(uVar89 >> 0x18));
    auVar64._9_6_ = 0;
    auVar64._0_9_ = Var50;
    auVar51._1_10_ = SUB1510(auVar64 << 0x30,5);
    auVar51[0] = (char)(uVar89 >> 0x10);
    auVar65._11_4_ = 0;
    auVar65._0_11_ = auVar51;
    auVar52._1_12_ = SUB1512(auVar65 << 0x20,3);
    auVar52[0] = (char)(uVar89 >> 8);
    sVar78 = (ushort)(byte)uVar89 + auVar127._0_2_;
    sVar93 = auVar52._0_2_ + auVar118._0_2_;
    sVar81 = auVar51._0_2_ + auVar136._0_2_;
    sVar94 = (short)Var50 + auVar105._0_2_;
    sVar82 = auVar40._8_2_ + auVar127._8_2_;
    sVar83 = auVar28._10_2_ + auVar118._8_2_;
    sVar88 = auVar16._12_2_ + auVar136._8_2_;
    sVar84 = (auVar10._13_2_ >> 8) + auVar105._8_2_;
    auVar5._8_6_ = 0;
    auVar5._0_8_ = uVar103;
    auVar5[0xe] = (char)(uVar103 >> 0x38);
    auVar11._8_4_ = 0;
    auVar11._0_8_ = uVar103;
    auVar11[0xc] = (char)(uVar103 >> 0x30);
    auVar11._13_2_ = auVar5._13_2_;
    auVar17._8_4_ = 0;
    auVar17._0_8_ = uVar103;
    auVar17._12_3_ = auVar11._12_3_;
    auVar23._8_2_ = 0;
    auVar23._0_8_ = uVar103;
    auVar23[10] = (char)(uVar103 >> 0x28);
    auVar23._11_4_ = auVar17._11_4_;
    auVar29._8_2_ = 0;
    auVar29._0_8_ = uVar103;
    auVar29._10_5_ = auVar23._10_5_;
    auVar35[8] = (char)(uVar103 >> 0x20);
    auVar35._0_8_ = uVar103;
    auVar35._9_6_ = auVar29._9_6_;
    auVar53._7_8_ = 0;
    auVar53._0_7_ = auVar35._8_7_;
    Var50 = CONCAT81(SUB158(auVar53 << 0x40,7),(char)(uVar103 >> 0x18));
    auVar66._9_6_ = 0;
    auVar66._0_9_ = Var50;
    auVar54._1_10_ = SUB1510(auVar66 << 0x30,5);
    auVar54[0] = (char)(uVar103 >> 0x10);
    auVar67._11_4_ = 0;
    auVar67._0_11_ = auVar54;
    auVar43[2] = (char)(uVar103 >> 8);
    auVar43._0_2_ = (ushort)uVar103;
    auVar43._3_12_ = SUB1512(auVar67 << 0x20,3);
    sVar95 = ((ushort)uVar103 & 0xff) + auVar127._2_2_;
    sVar85 = auVar43._2_2_ + auVar118._2_2_;
    sVar98 = auVar54._0_2_ + auVar136._2_2_;
    sVar86 = (short)Var50 + auVar105._2_2_;
    sVar87 = auVar35._8_2_ + auVar127._10_2_;
    sVar96 = auVar23._10_2_ + auVar118._10_2_;
    sVar99 = auVar11._12_2_ + auVar136._10_2_;
    sVar101 = (auVar5._13_2_ >> 8) + auVar105._10_2_;
    auVar6._8_6_ = 0;
    auVar6._0_8_ = uVar1;
    auVar6[0xe] = (char)(uVar1 >> 0x38);
    auVar12._8_4_ = 0;
    auVar12._0_8_ = uVar1;
    auVar12[0xc] = (char)(uVar1 >> 0x30);
    auVar12._13_2_ = auVar6._13_2_;
    auVar18._8_4_ = 0;
    auVar18._0_8_ = uVar1;
    auVar18._12_3_ = auVar12._12_3_;
    auVar24._8_2_ = 0;
    auVar24._0_8_ = uVar1;
    auVar24[10] = (char)(uVar1 >> 0x28);
    auVar24._11_4_ = auVar18._11_4_;
    auVar30._8_2_ = 0;
    auVar30._0_8_ = uVar1;
    auVar30._10_5_ = auVar24._10_5_;
    auVar36[8] = (char)(uVar1 >> 0x20);
    auVar36._0_8_ = uVar1;
    auVar36._9_6_ = auVar30._9_6_;
    auVar55._7_8_ = 0;
    auVar55._0_7_ = auVar36._8_7_;
    Var50 = CONCAT81(SUB158(auVar55 << 0x40,7),(char)(uVar1 >> 0x18));
    auVar68._9_6_ = 0;
    auVar68._0_9_ = Var50;
    auVar56._1_10_ = SUB1510(auVar68 << 0x30,5);
    auVar56[0] = (char)(uVar1 >> 0x10);
    auVar69._11_4_ = 0;
    auVar69._0_11_ = auVar56;
    auVar57._1_12_ = SUB1512(auVar69 << 0x20,3);
    auVar57[0] = (char)(uVar1 >> 8);
    sVar102 = (ushort)(byte)uVar1 + auVar127._4_2_;
    sVar107 = auVar57._0_2_ + auVar118._4_2_;
    sVar110 = auVar56._0_2_ + auVar136._4_2_;
    sVar108 = (short)Var50 + auVar105._4_2_;
    sVar134 = auVar36._8_2_ + auVar127._12_2_;
    sVar109 = auVar24._10_2_ + auVar118._12_2_;
    sVar137 = auVar12._12_2_ + auVar136._12_2_;
    sVar138 = (auVar6._13_2_ >> 8) + auVar105._12_2_;
    auVar7._8_6_ = 0;
    auVar7._0_8_ = uVar2;
    auVar7[0xe] = (char)(uVar2 >> 0x38);
    auVar13._8_4_ = 0;
    auVar13._0_8_ = uVar2;
    auVar13[0xc] = (char)(uVar2 >> 0x30);
    auVar13._13_2_ = auVar7._13_2_;
    auVar19._8_4_ = 0;
    auVar19._0_8_ = uVar2;
    auVar19._12_3_ = auVar13._12_3_;
    auVar25._8_2_ = 0;
    auVar25._0_8_ = uVar2;
    auVar25[10] = (char)(uVar2 >> 0x28);
    auVar25._11_4_ = auVar19._11_4_;
    auVar31._8_2_ = 0;
    auVar31._0_8_ = uVar2;
    auVar31._10_5_ = auVar25._10_5_;
    auVar37[8] = (char)(uVar2 >> 0x20);
    auVar37._0_8_ = uVar2;
    auVar37._9_6_ = auVar31._9_6_;
    auVar58._7_8_ = 0;
    auVar58._0_7_ = auVar37._8_7_;
    Var50 = CONCAT81(SUB158(auVar58 << 0x40,7),(char)(uVar2 >> 0x18));
    auVar70._9_6_ = 0;
    auVar70._0_9_ = Var50;
    auVar59._1_10_ = SUB1510(auVar70 << 0x30,5);
    auVar59[0] = (char)(uVar2 >> 0x10);
    auVar71._11_4_ = 0;
    auVar71._0_11_ = auVar59;
    auVar44[2] = (char)(uVar2 >> 8);
    auVar44._0_2_ = (ushort)uVar2;
    auVar44._3_12_ = SUB1512(auVar71 << 0x20,3);
    sVar111 = ((ushort)uVar2 & 0xff) + auVar127._6_2_;
    sVar139 = auVar44._2_2_ + auVar118._6_2_;
    sVar112 = auVar59._0_2_ + auVar136._6_2_;
    sVar140 = (short)Var50 + auVar105._6_2_;
    sVar113 = auVar37._8_2_ + auVar127._14_2_;
    sVar141 = auVar25._10_2_ + auVar118._14_2_;
    sVar120 = auVar13._12_2_ + auVar136._14_2_;
    sVar121 = (auVar7._13_2_ >> 8) + auVar105._14_2_;
    *(ulong *)dst =
         CONCAT17((0 < sVar84) * (sVar84 < 0x100) * (char)sVar84 - (0xff < sVar84),
                  CONCAT16((0 < sVar88) * (sVar88 < 0x100) * (char)sVar88 - (0xff < sVar88),
                           CONCAT15((0 < sVar83) * (sVar83 < 0x100) * (char)sVar83 - (0xff < sVar83)
                                    ,CONCAT14((0 < sVar82) * (sVar82 < 0x100) * (char)sVar82 -
                                              (0xff < sVar82),
                                              CONCAT13((0 < sVar94) * (sVar94 < 0x100) *
                                                       (char)sVar94 - (0xff < sVar94),
                                                       CONCAT12((0 < sVar81) * (sVar81 < 0x100) *
                                                                (char)sVar81 - (0xff < sVar81),
                                                                CONCAT11((0 < sVar93) *
                                                                         (sVar93 < 0x100) *
                                                                         (char)sVar93 -
                                                                         (0xff < sVar93),
                                                                         (0 < sVar78) *
                                                                         (sVar78 < 0x100) *
                                                                         (char)sVar78 -
                                                                         (0xff < sVar78))))))));
    *(ulong *)(dst + 0x20) =
         CONCAT17((0 < sVar101) * (sVar101 < 0x100) * (char)sVar101 - (0xff < sVar101),
                  CONCAT16((0 < sVar99) * (sVar99 < 0x100) * (char)sVar99 - (0xff < sVar99),
                           CONCAT15((0 < sVar96) * (sVar96 < 0x100) * (char)sVar96 - (0xff < sVar96)
                                    ,CONCAT14((0 < sVar87) * (sVar87 < 0x100) * (char)sVar87 -
                                              (0xff < sVar87),
                                              CONCAT13((0 < sVar86) * (sVar86 < 0x100) *
                                                       (char)sVar86 - (0xff < sVar86),
                                                       CONCAT12((0 < sVar98) * (sVar98 < 0x100) *
                                                                (char)sVar98 - (0xff < sVar98),
                                                                CONCAT11((0 < sVar85) *
                                                                         (sVar85 < 0x100) *
                                                                         (char)sVar85 -
                                                                         (0xff < sVar85),
                                                                         (0 < sVar95) *
                                                                         (sVar95 < 0x100) *
                                                                         (char)sVar95 -
                                                                         (0xff < sVar95))))))));
    *(ulong *)(dst + 0x40) =
         CONCAT17((0 < sVar138) * (sVar138 < 0x100) * (char)sVar138 - (0xff < sVar138),
                  CONCAT16((0 < sVar137) * (sVar137 < 0x100) * (char)sVar137 - (0xff < sVar137),
                           CONCAT15((0 < sVar109) * (sVar109 < 0x100) * (char)sVar109 -
                                    (0xff < sVar109),
                                    CONCAT14((0 < sVar134) * (sVar134 < 0x100) * (char)sVar134 -
                                             (0xff < sVar134),
                                             CONCAT13((0 < sVar108) * (sVar108 < 0x100) *
                                                      (char)sVar108 - (0xff < sVar108),
                                                      CONCAT12((0 < sVar110) * (sVar110 < 0x100) *
                                                               (char)sVar110 - (0xff < sVar110),
                                                               CONCAT11((0 < sVar107) *
                                                                        (sVar107 < 0x100) *
                                                                        (char)sVar107 -
                                                                        (0xff < sVar107),
                                                                        (0 < sVar102) *
                                                                        (sVar102 < 0x100) *
                                                                        (char)sVar102 -
                                                                        (0xff < sVar102))))))));
    *(ulong *)(dst + 0x60) =
         CONCAT17((0 < sVar121) * (sVar121 < 0x100) * (char)sVar121 - (0xff < sVar121),
                  CONCAT16((0 < sVar120) * (sVar120 < 0x100) * (char)sVar120 - (0xff < sVar120),
                           CONCAT15((0 < sVar141) * (sVar141 < 0x100) * (char)sVar141 -
                                    (0xff < sVar141),
                                    CONCAT14((0 < sVar113) * (sVar113 < 0x100) * (char)sVar113 -
                                             (0xff < sVar113),
                                             CONCAT13((0 < sVar140) * (sVar140 < 0x100) *
                                                      (char)sVar140 - (0xff < sVar140),
                                                      CONCAT12((0 < sVar112) * (sVar112 < 0x100) *
                                                               (char)sVar112 - (0xff < sVar112),
                                                               CONCAT11((0 < sVar139) *
                                                                        (sVar139 < 0x100) *
                                                                        (char)sVar139 -
                                                                        (0xff < sVar139),
                                                                        (0 < sVar111) *
                                                                        (sVar111 < 0x100) *
                                                                        (char)sVar111 -
                                                                        (0xff < sVar111))))))));
    return;
  }
  auVar127 = *(undefined1 (*) [16])in;
  auVar136 = *(undefined1 (*) [16])(in + 8);
  auVar92._0_8_ = auVar127._8_8_;
  auVar92._8_4_ = auVar127._8_4_;
  auVar92._12_4_ = auVar127._12_4_;
  auVar106._0_8_ = auVar136._8_8_;
  auVar106._8_4_ = auVar136._8_4_;
  auVar106._12_4_ = auVar136._12_4_;
  sVar96 = auVar136._0_2_ + auVar127._0_2_;
  sVar84 = auVar136._2_2_ + auVar127._2_2_;
  sVar95 = auVar136._4_2_ + auVar127._4_2_;
  sVar85 = auVar136._6_2_ + auVar127._6_2_;
  sVar78 = auVar127._0_2_ - auVar136._0_2_;
  sVar81 = auVar127._2_2_ - auVar136._2_2_;
  sVar82 = auVar127._4_2_ - auVar136._4_2_;
  sVar83 = auVar127._6_2_ - auVar136._6_2_;
  auVar105 = pmulhw(auVar92,_DAT_0017f6d0);
  auVar118 = pmulhw(auVar106,_DAT_0017f6e0);
  sVar99 = (auVar127._8_2_ - auVar136._8_2_) + (auVar105._0_2_ - auVar118._0_2_);
  sVar102 = (auVar127._10_2_ - auVar136._10_2_) + (auVar105._2_2_ - auVar118._2_2_);
  sVar107 = (auVar127._12_2_ - auVar136._12_2_) + (auVar105._4_2_ - auVar118._4_2_);
  sVar108 = (auVar127._14_2_ - auVar136._14_2_) + (auVar105._6_2_ - auVar118._6_2_);
  sVar88 = auVar118._8_2_ + auVar105._8_2_ + auVar136._8_2_ + auVar127._8_2_;
  sVar93 = auVar118._10_2_ + auVar105._10_2_ + auVar136._10_2_ + auVar127._10_2_;
  sVar94 = auVar118._12_2_ + auVar105._12_2_ + auVar136._12_2_ + auVar127._12_2_;
  sVar87 = auVar118._14_2_ + auVar105._14_2_ + auVar136._14_2_ + auVar127._14_2_;
  sVar101 = sVar84 + sVar93;
  sVar98 = sVar95 + sVar94;
  sVar110 = sVar85 + sVar87;
  sVar134 = sVar81 + sVar102;
  sVar86 = sVar82 + sVar107;
  sVar109 = sVar83 + sVar108;
  sVar81 = sVar81 - sVar102;
  sVar82 = sVar82 - sVar107;
  sVar83 = sVar83 - sVar108;
  sVar84 = sVar84 - sVar93;
  sVar95 = sVar95 - sVar94;
  sVar85 = sVar85 - sVar87;
  auVar136._2_8_ =
       (long)(CONCAT64(CONCAT42(CONCAT22(sVar83,sVar110),sVar82),CONCAT22(sVar98,sVar110)) >> 0x10);
  auVar136._0_2_ = sVar81;
  auVar136._10_6_ = 0;
  auVar127._12_4_ = 0;
  auVar127._0_12_ = SUB1612(auVar136 << 0x30,4);
  auVar127 = auVar127 << 0x20;
  auVar105._0_12_ = auVar127._0_12_;
  auVar105._12_2_ = sVar81;
  auVar105._14_2_ = sVar84;
  auVar118._12_4_ = auVar105._12_4_;
  auVar118._0_10_ = auVar127._0_10_;
  auVar118._10_2_ = sVar134;
  auVar126._10_6_ = auVar118._10_6_;
  auVar126._0_8_ = auVar127._0_8_;
  auVar126._8_2_ = sVar101;
  auVar119._4_4_ = auVar118._12_4_;
  auVar119._0_4_ = auVar126._8_4_;
  auVar119._8_4_ = auVar126._8_4_;
  auVar119._12_4_ = auVar118._12_4_;
  sVar93 = sVar96 + sVar88 + 4;
  sVar94 = sVar78 + sVar99 + 4;
  sVar78 = (sVar78 - sVar99) + 4;
  sVar88 = (sVar96 - sVar88) + 4;
  uVar72 = CONCAT24(sVar109,CONCAT22(sVar110,sVar95));
  sVar99 = sVar93 + sVar98;
  sVar102 = sVar94 + sVar86;
  sVar107 = sVar78 + sVar82;
  sVar108 = sVar88 + sVar95;
  sVar93 = sVar93 - sVar98;
  sVar94 = sVar94 - sVar86;
  sVar78 = sVar78 - sVar82;
  sVar88 = sVar88 - sVar95;
  auVar136 = pmulhw(auVar119,_DAT_0017f6d0);
  uVar97 = (undefined4)((uint6)uVar72 >> 0x10);
  uVar100 = (undefined4)(CONCAT28(sVar85,CONCAT26(sVar83,uVar72)) >> 0x30);
  auVar77._4_4_ = uVar100;
  auVar77._0_4_ = uVar97;
  auVar77._8_4_ = uVar97;
  auVar77._12_4_ = uVar100;
  auVar127 = pmulhw(auVar77,_DAT_0017f6e0);
  sVar98 = (sVar101 - sVar110) + (auVar136._0_2_ - auVar127._0_2_);
  sVar86 = (sVar134 - sVar109) + (auVar136._2_2_ - auVar127._2_2_);
  sVar87 = (sVar81 - sVar83) + (auVar136._4_2_ - auVar127._4_2_);
  sVar96 = (sVar84 - sVar85) + (auVar136._6_2_ - auVar127._6_2_);
  sVar82 = auVar127._8_2_ + auVar136._8_2_ + sVar101 + sVar110;
  sVar95 = auVar127._10_2_ + auVar136._10_2_ + sVar134 + sVar109;
  sVar81 = auVar127._12_2_ + auVar136._12_2_ + sVar81 + sVar83;
  sVar83 = auVar127._14_2_ + auVar136._14_2_ + sVar84 + sVar85;
  auVar80._0_2_ = sVar99 + sVar82;
  auVar80._2_2_ = sVar102 + sVar95;
  auVar80._4_2_ = sVar107 + sVar81;
  auVar80._6_2_ = sVar108 + sVar83;
  auVar80._8_2_ = sVar93 + sVar98;
  auVar80._10_2_ = sVar94 + sVar86;
  auVar80._12_2_ = sVar78 + sVar87;
  auVar80._14_2_ = sVar88 + sVar96;
  auVar136 = psraw(auVar80,3);
  auVar135._0_2_ = sVar93 - sVar98;
  auVar135._2_2_ = sVar94 - sVar86;
  auVar135._4_2_ = sVar78 - sVar87;
  auVar135._6_2_ = sVar88 - sVar96;
  auVar135._8_2_ = sVar99 - sVar82;
  auVar135._10_2_ = sVar102 - sVar95;
  auVar135._12_2_ = sVar107 - sVar81;
  auVar135._14_2_ = sVar108 - sVar83;
  auVar127 = psraw(auVar135,3);
  uVar97 = *(undefined4 *)(ref + 0x20);
  uVar100 = *(undefined4 *)ref;
  uVar89 = CONCAT44(uVar97,uVar100);
  uVar3 = *(undefined4 *)(ref + 0x60);
  uVar4 = *(undefined4 *)(ref + 0x40);
  uVar103 = CONCAT44(uVar3,uVar4);
  auVar8._8_6_ = 0;
  auVar8._0_8_ = uVar89;
  auVar8[0xe] = (char)((uint)uVar97 >> 0x18);
  auVar14._8_4_ = 0;
  auVar14._0_8_ = uVar89;
  auVar14[0xc] = (char)((uint)uVar97 >> 0x10);
  auVar14._13_2_ = auVar8._13_2_;
  auVar20._8_4_ = 0;
  auVar20._0_8_ = uVar89;
  auVar20._12_3_ = auVar14._12_3_;
  auVar26._8_2_ = 0;
  auVar26._0_8_ = uVar89;
  auVar26[10] = (char)((uint)uVar97 >> 8);
  auVar26._11_4_ = auVar20._11_4_;
  auVar32._8_2_ = 0;
  auVar32._0_8_ = uVar89;
  auVar32._10_5_ = auVar26._10_5_;
  auVar38[8] = (char)uVar97;
  auVar38._0_8_ = uVar89;
  auVar38._9_6_ = auVar32._9_6_;
  auVar60._7_8_ = 0;
  auVar60._0_7_ = auVar38._8_7_;
  Var50 = CONCAT81(SUB158(auVar60 << 0x40,7),(char)((uint)uVar100 >> 0x18));
  auVar73._9_6_ = 0;
  auVar73._0_9_ = Var50;
  auVar41[4] = (char)((uint)uVar100 >> 0x10);
  auVar41._0_4_ = uVar100;
  auVar41._5_10_ = SUB1510(auVar73 << 0x30,5);
  auVar61._11_4_ = 0;
  auVar61._0_11_ = auVar41._4_11_;
  auVar45[2] = (char)((uint)uVar100 >> 8);
  auVar45._0_2_ = (ushort)uVar100;
  auVar45._3_12_ = SUB1512(auVar61 << 0x20,3);
  sVar78 = ((ushort)uVar100 & 0xff) + auVar136._0_2_;
  sVar93 = auVar45._2_2_ + auVar136._8_2_;
  sVar81 = auVar41._4_2_ + auVar127._0_2_;
  sVar94 = (short)Var50 + auVar127._8_2_;
  sVar82 = auVar38._8_2_ + auVar136._2_2_;
  sVar83 = auVar26._10_2_ + auVar136._10_2_;
  sVar88 = auVar14._12_2_ + auVar127._2_2_;
  sVar84 = (auVar8._13_2_ >> 8) + auVar127._10_2_;
  auVar9._8_6_ = 0;
  auVar9._0_8_ = uVar103;
  auVar9[0xe] = (char)((uint)uVar3 >> 0x18);
  auVar15._8_4_ = 0;
  auVar15._0_8_ = uVar103;
  auVar15[0xc] = (char)((uint)uVar3 >> 0x10);
  auVar15._13_2_ = auVar9._13_2_;
  auVar21._8_4_ = 0;
  auVar21._0_8_ = uVar103;
  auVar21._12_3_ = auVar15._12_3_;
  auVar27._8_2_ = 0;
  auVar27._0_8_ = uVar103;
  auVar27[10] = (char)((uint)uVar3 >> 8);
  auVar27._11_4_ = auVar21._11_4_;
  auVar33._8_2_ = 0;
  auVar33._0_8_ = uVar103;
  auVar33._10_5_ = auVar27._10_5_;
  auVar39[8] = (char)uVar3;
  auVar39._0_8_ = uVar103;
  auVar39._9_6_ = auVar33._9_6_;
  auVar62._7_8_ = 0;
  auVar62._0_7_ = auVar39._8_7_;
  Var50 = CONCAT81(SUB158(auVar62 << 0x40,7),(char)((uint)uVar4 >> 0x18));
  auVar74._9_6_ = 0;
  auVar74._0_9_ = Var50;
  auVar42[4] = (char)((uint)uVar4 >> 0x10);
  auVar42._0_4_ = uVar4;
  auVar42._5_10_ = SUB1510(auVar74 << 0x30,5);
  auVar63._11_4_ = 0;
  auVar63._0_11_ = auVar42._4_11_;
  auVar46[2] = (char)((uint)uVar4 >> 8);
  auVar46._0_2_ = (ushort)uVar4;
  auVar46._3_12_ = SUB1512(auVar63 << 0x20,3);
  sVar95 = ((ushort)uVar4 & 0xff) + auVar136._4_2_;
  sVar85 = auVar46._2_2_ + auVar136._12_2_;
  sVar98 = auVar42._4_2_ + auVar127._4_2_;
  sVar86 = (short)Var50 + auVar127._12_2_;
  sVar87 = auVar39._8_2_ + auVar136._6_2_;
  sVar96 = auVar27._10_2_ + auVar136._14_2_;
  sVar99 = auVar15._12_2_ + auVar127._6_2_;
  sVar101 = (auVar9._13_2_ >> 8) + auVar127._14_2_;
  *dst = (0 < sVar78) * (sVar78 < 0x100) * (char)sVar78 - (0xff < sVar78);
  dst[1] = (0 < sVar93) * (sVar93 < 0x100) * (char)sVar93 - (0xff < sVar93);
  dst[2] = (0 < sVar81) * (sVar81 < 0x100) * (char)sVar81 - (0xff < sVar81);
  dst[3] = (0 < sVar94) * (sVar94 < 0x100) * (char)sVar94 - (0xff < sVar94);
  dst[0x24] = (0 < sVar82) * (sVar82 < 0x100) * (char)sVar82 - (0xff < sVar82);
  dst[0x25] = (0 < sVar83) * (sVar83 < 0x100) * (char)sVar83 - (0xff < sVar83);
  dst[0x26] = (0 < sVar88) * (sVar88 < 0x100) * (char)sVar88 - (0xff < sVar88);
  dst[0x27] = (0 < sVar84) * (sVar84 < 0x100) * (char)sVar84 - (0xff < sVar84);
  *(uint *)(dst + 0x40) =
       CONCAT13((0 < sVar86) * (sVar86 < 0x100) * (char)sVar86 - (0xff < sVar86),
                CONCAT12((0 < sVar98) * (sVar98 < 0x100) * (char)sVar98 - (0xff < sVar98),
                         CONCAT11((0 < sVar85) * (sVar85 < 0x100) * (char)sVar85 - (0xff < sVar85),
                                  (0 < sVar95) * (sVar95 < 0x100) * (char)sVar95 - (0xff < sVar95)))
               );
  dst[0x6c] = (0 < sVar87) * (sVar87 < 0x100) * (char)sVar87 - (0xff < sVar87);
  dst[0x6d] = (0 < sVar96) * (sVar96 < 0x100) * (char)sVar96 - (0xff < sVar96);
  dst[0x6e] = (0 < sVar99) * (sVar99 < 0x100) * (char)sVar99 - (0xff < sVar99);
  dst[0x6f] = (0 < sVar101) * (sVar101 < 0x100) * (char)sVar101 - (0xff < sVar101);
  return;
}

Assistant:

static void ITransform_SSE2(const uint8_t* WEBP_RESTRICT ref,
                            const int16_t* WEBP_RESTRICT in,
                            uint8_t* WEBP_RESTRICT dst,
                            int do_two) {
  if (do_two) {
    ITransform_Two_SSE2(ref, in, dst);
  } else {
    ITransform_One_SSE2(ref, in, dst);
  }
}